

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLNodeAdapter.cxx
# Opt level: O0

optional<XMLNodeAdapter> *
getTopNodeFromFile(optional<XMLNodeAdapter> *__return_storage_ptr__,string_view fileName,
                  string_view topNodeName)

{
  char cVar1;
  const_pointer filename;
  const_pointer tag;
  exception *anon_var_0;
  XMLNode local_68;
  XMLNodeAdapter local_60;
  XMLNode local_38;
  XMLNode node;
  string_view topNodeName_local;
  string_view fileName_local;
  
  topNodeName_local._M_len = (size_t)topNodeName._M_str;
  node.d = (XMLNodeData *)topNodeName._M_len;
  topNodeName_local._M_str = (char *)fileName._M_len;
  filename = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)
                        &topNodeName_local._M_str);
  tag = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)&node);
  XMLParser::XMLNode::openFileHelperThrows(&local_38,filename,tag);
  cVar1 = XMLParser::XMLNode::isEmpty(&local_38);
  if (cVar1 == '\0') {
    XMLParser::XMLNode::XMLNode(&local_68,&local_38);
    XMLNodeAdapter::XMLNodeAdapter(&local_60,&local_68);
    std::optional<XMLNodeAdapter>::optional<XMLNodeAdapter,_true>(__return_storage_ptr__,&local_60);
    XMLNodeAdapter::~XMLNodeAdapter(&local_60);
    XMLParser::XMLNode::~XMLNode(&local_68);
  }
  XMLParser::XMLNode::~XMLNode(&local_38);
  if (cVar1 != '\0') {
    std::optional<XMLNodeAdapter>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<XMLNodeAdapter> getTopNodeFromFile(std::string_view fileName,
                                                 std::string_view topNodeName)
{
    try
    {
        auto node = XMLParser::XMLNode::openFileHelperThrows(fileName.data(), topNodeName.data());
        if(!node.isEmpty())
        {
            return XMLNodeAdapter(node);
        }
    }
    catch(const std::exception &)
    {
        // No need to log message for now. Empty optional will be returned indicating failure.
    }
    // Return empty optional if node is empty or an exception occurred
    return std::nullopt;
}